

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

WeightParams * __thiscall
CoreML::Specification::BatchedMatMulLayerParams::_internal_mutable_weights
          (BatchedMatMulLayerParams *this)

{
  ulong uVar1;
  WeightParams *pWVar2;
  Arena *arena;
  
  if (this->weights_ != (WeightParams *)0x0) {
    return this->weights_;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>(arena);
  this->weights_ = pWVar2;
  return pWVar2;
}

Assistant:

inline ::CoreML::Specification::WeightParams* BatchedMatMulLayerParams::_internal_mutable_weights() {
  
  if (weights_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::WeightParams>(GetArenaForAllocation());
    weights_ = p;
  }
  return weights_;
}